

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void av1_rc_update_rate_correction_factors(AV1_COMP *cpi,int is_encode_stage,int width,int height)

{
  int iVar1;
  CYCLIC_REFRESH *pCVar2;
  AV1_PRIMARY *pAVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int *local_38;
  
  dVar9 = get_rate_correction_factor(cpi,width,height);
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    if ((cpi->rc).is_src_frame_alt_ref != 0) {
      return;
    }
    if (((((cpi->sf).rt_sf.overshoot_detection_cbr == '\x01') && ((cpi->rc).high_source_sad != 0))
        && (cpi->cyclic_refresh->counter_encode_maxq_scene_change == 0)) &&
       ((((cpi->common).current_frame.frame_type & 0xfd) != 0 && (cpi->ppi->use_svc == 0)))) {
      iVar5 = (cpi->common).quant_params.base_qindex;
      (cpi->rc).q_2_frame = iVar5;
      (cpi->rc).q_1_frame = iVar5;
      (cpi->rc).rc_1_frame = 0;
      (cpi->rc).rc_2_frame = 0;
      return;
    }
    if ((cpi->common).seg.enabled == '\0') goto LAB_00933f99;
    iVar5 = av1_cyclic_refresh_estimate_bits_at_q(cpi,dVar9);
    bVar4 = true;
  }
  else {
    if ((cpi->rc).is_src_frame_alt_ref != 0) {
      return;
    }
LAB_00933f99:
    iVar5 = av1_estimate_bits_at_q(cpi,(cpi->common).quant_params.base_qindex,dVar9);
    bVar4 = false;
  }
  local_38 = &(cpi->rc).is_src_frame_alt_ref;
  if (iVar5 < 0xc9) {
    dVar10 = 1.0;
  }
  else {
    dVar10 = (double)(cpi->rc).projected_frame_size / (double)iVar5;
  }
  if (dVar10 <= 0.25) {
    dVar10 = 0.25;
  }
  (cpi->rc).q_2_frame = (cpi->rc).q_1_frame;
  (cpi->rc).q_1_frame = (cpi->common).quant_params.base_qindex;
  uVar6 = 0xffffffff;
  if (dVar10 <= 1.1) {
    uVar6 = (uint)(dVar10 < 0.9);
  }
  (cpi->rc).rc_2_frame = (cpi->rc).rc_1_frame;
  (cpi->rc).rc_1_frame = uVar6;
  iVar5 = cpi->is_screen_content_type;
  dVar11 = log10(dVar10);
  dVar12 = 0.5;
  if (iVar5 == 0) {
    if (ABS(dVar11) <= 0.5) {
      dVar12 = log10(dVar10);
      dVar12 = ABS(dVar12);
    }
    dVar12 = dVar12 * 0.75;
  }
  else {
    if (ABS(dVar11) <= 0.5) {
      dVar12 = log10(dVar10);
      dVar12 = ABS(dVar12);
    }
    dVar12 = dVar12 * 0.5;
  }
  if ((bVar4) && (0 < (cpi->rc).this_frame_target)) {
    pCVar2 = cpi->cyclic_refresh;
    if (dVar10 <= 1.25) {
      if (0.5 <= dVar10) goto LAB_00934135;
      iVar5 = 5;
      if (pCVar2->percent_refresh_adjustment < 4) {
        iVar5 = pCVar2->percent_refresh_adjustment + 1;
      }
      pCVar2->percent_refresh_adjustment = iVar5;
      dVar11 = pCVar2->rate_ratio_qdelta_adjustment + 0.05;
      if (0.25 <= dVar11) {
        dVar11 = 0.25;
      }
    }
    else {
      iVar5 = -5;
      if (-4 < pCVar2->percent_refresh_adjustment) {
        iVar5 = pCVar2->percent_refresh_adjustment + -1;
      }
      pCVar2->percent_refresh_adjustment = iVar5;
      dVar11 = pCVar2->rate_ratio_qdelta_adjustment + -0.05;
      if (dVar11 <= -0.0) {
        dVar11 = -0.0;
      }
    }
    pCVar2->rate_ratio_qdelta_adjustment = dVar11;
  }
LAB_00934135:
  if (dVar10 <= 1.01) {
    if ((dVar10 < 0.99) &&
       (dVar9 = dVar9 * (1.0 / ((1.0 / dVar10 + -1.0) * (dVar12 + 0.25) + 1.0)), dVar9 < 0.005)) {
      dVar9 = 0.005;
    }
  }
  else {
    dVar9 = dVar9 * ((dVar10 + -1.0) * (dVar12 + 0.25) + 1.0);
    if (50.0 < dVar9) {
      dVar9 = 50.0;
    }
  }
  pAVar3 = cpi->ppi;
  iVar5 = (cpi->oxcf).frm_dim_cfg.width;
  iVar1 = (cpi->oxcf).frm_dim_cfg.height;
  if ((cpi->common).current_frame.frame_type == '\0') {
    pdVar8 = (pAVar3->p_rc).rate_correction_factors + 3;
  }
  else {
    iVar7 = is_stat_consumption_stage(cpi);
    if (iVar7 == 0) {
      if (((((cpi->refresh_frame).alt_ref_frame == false) &&
           ((cpi->refresh_frame).golden_frame != true)) || (*local_38 != 0)) ||
         ((pAVar3->use_svc != 0 ||
          (((cpi->oxcf).rc_cfg.mode == AOM_CBR && ((cpi->oxcf).rc_cfg.gf_cbr_boost_pct < 0x15))))))
      {
        if ((is_encode_stage == 0) ||
           ((pAVar3->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1)) {
          pdVar8 = (pAVar3->p_rc).rate_correction_factors;
        }
        else {
          pdVar8 = (cpi->rc).frame_level_rate_correction_factors;
        }
      }
      else {
        pdVar8 = (pAVar3->p_rc).rate_correction_factors + 2;
      }
    }
    else if ((is_encode_stage == 0) ||
            ((pAVar3->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1)) {
      pdVar8 = (pAVar3->p_rc).rate_correction_factors +
               "\x03"[(pAVar3->gf_group).update_type[cpi->gf_frame_index]];
    }
    else {
      pdVar8 = (cpi->rc).frame_level_rate_correction_factors +
               "\x03"[(pAVar3->gf_group).update_type[cpi->gf_frame_index]];
    }
  }
  dVar9 = dVar9 / ((double)(iVar1 * iVar5) / (double)(height * width));
  dVar10 = 50.0;
  if (dVar9 <= 50.0) {
    dVar10 = dVar9;
  }
  *pdVar8 = (double)(-(ulong)(dVar9 < 0.005) & 0x3f747ae147ae147b |
                    ~-(ulong)(dVar9 < 0.005) & (ulong)dVar10);
  return;
}

Assistant:

void av1_rc_update_rate_correction_factors(AV1_COMP *cpi, int is_encode_stage,
                                           int width, int height) {
  const AV1_COMMON *const cm = &cpi->common;
  double correction_factor = 1.0;
  double rate_correction_factor =
      get_rate_correction_factor(cpi, width, height);
  double adjustment_limit;
  int projected_size_based_on_q = 0;
  int cyclic_refresh_active =
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ && cpi->common.seg.enabled;

  // Do not update the rate factors for arf overlay frames.
  if (cpi->rc.is_src_frame_alt_ref) return;

  // Don't update rate correction factors here on scene changes as
  // it is already reset in av1_encodedframe_overshoot_cbr(),
  // but reset variables related to previous frame q and size.
  // Note that the counter of frames since the last scene change
  // is only valid when cyclic refresh mode is enabled and that
  // this break out only applies to scene changes that are not
  // recorded as INTRA only key frames.
  // Note that av1_encodedframe_overshoot_cbr() is only entered
  // if cpi->sf.rt_sf.overshoot_detection_cbr == FAST_DETECTION_MAXQ
  // and cpi->rc.high_source_sad = 1.
  if ((cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ) &&
      (cpi->sf.rt_sf.overshoot_detection_cbr == FAST_DETECTION_MAXQ) &&
      cpi->rc.high_source_sad &&
      (cpi->cyclic_refresh->counter_encode_maxq_scene_change == 0) &&
      !frame_is_intra_only(cm) && !cpi->ppi->use_svc) {
    cpi->rc.q_2_frame = cm->quant_params.base_qindex;
    cpi->rc.q_1_frame = cm->quant_params.base_qindex;
    cpi->rc.rc_2_frame = 0;
    cpi->rc.rc_1_frame = 0;
    return;
  }

  // Clear down mmx registers to allow floating point in what follows

  // Work out how big we would have expected the frame to be at this Q given
  // the current correction factor.
  // Stay in double to avoid int overflow when values are large
  if (cyclic_refresh_active) {
    projected_size_based_on_q =
        av1_cyclic_refresh_estimate_bits_at_q(cpi, rate_correction_factor);
  } else {
    projected_size_based_on_q = av1_estimate_bits_at_q(
        cpi, cm->quant_params.base_qindex, rate_correction_factor);
  }
  // Work out a size correction factor.
  if (projected_size_based_on_q > FRAME_OVERHEAD_BITS)
    correction_factor = (double)cpi->rc.projected_frame_size /
                        (double)projected_size_based_on_q;

  // Clamp correction factor to prevent anything too extreme
  correction_factor = AOMMAX(correction_factor, 0.25);

  cpi->rc.q_2_frame = cpi->rc.q_1_frame;
  cpi->rc.q_1_frame = cm->quant_params.base_qindex;
  cpi->rc.rc_2_frame = cpi->rc.rc_1_frame;
  if (correction_factor > 1.1)
    cpi->rc.rc_1_frame = -1;
  else if (correction_factor < 0.9)
    cpi->rc.rc_1_frame = 1;
  else
    cpi->rc.rc_1_frame = 0;

  // Decide how heavily to dampen the adjustment
  if (correction_factor > 0.0) {
    if (cpi->is_screen_content_type) {
      adjustment_limit =
          0.25 + 0.5 * AOMMIN(0.5, fabs(log10(correction_factor)));
    } else {
      adjustment_limit =
          0.25 + 0.75 * AOMMIN(0.5, fabs(log10(correction_factor)));
    }
  } else {
    adjustment_limit = 0.75;
  }

  // Adjustment to delta Q and number of blocks updated in cyclic refresh
  // based on over or under shoot of target in current frame.
  if (cyclic_refresh_active && cpi->rc.this_frame_target > 0) {
    CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
    if (correction_factor > 1.25) {
      cr->percent_refresh_adjustment =
          AOMMAX(cr->percent_refresh_adjustment - 1, -5);
      cr->rate_ratio_qdelta_adjustment =
          AOMMAX(cr->rate_ratio_qdelta_adjustment - 0.05, -0.0);
    } else if (correction_factor < 0.5) {
      cr->percent_refresh_adjustment =
          AOMMIN(cr->percent_refresh_adjustment + 1, 5);
      cr->rate_ratio_qdelta_adjustment =
          AOMMIN(cr->rate_ratio_qdelta_adjustment + 0.05, 0.25);
    }
  }

  if (correction_factor > 1.01) {
    // We are not already at the worst allowable quality
    correction_factor = (1.0 + ((correction_factor - 1.0) * adjustment_limit));
    rate_correction_factor = rate_correction_factor * correction_factor;
    // Keep rate_correction_factor within limits
    if (rate_correction_factor > MAX_BPB_FACTOR)
      rate_correction_factor = MAX_BPB_FACTOR;
  } else if (correction_factor < 0.99) {
    // We are not already at the best allowable quality
    correction_factor = 1.0 / correction_factor;
    correction_factor = (1.0 + ((correction_factor - 1.0) * adjustment_limit));
    correction_factor = 1.0 / correction_factor;

    rate_correction_factor = rate_correction_factor * correction_factor;

    // Keep rate_correction_factor within limits
    if (rate_correction_factor < MIN_BPB_FACTOR)
      rate_correction_factor = MIN_BPB_FACTOR;
  }

  set_rate_correction_factor(cpi, is_encode_stage, rate_correction_factor,
                             width, height);
}